

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuStringTemplate.cpp
# Opt level: O0

void __thiscall tcu::StringTemplate::~StringTemplate(StringTemplate *this)

{
  StringTemplate *this_local;
  
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

StringTemplate::~StringTemplate (void)
{
}